

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O2

void __thiscall
myvk::CommandBuffer::CmdGenerateMipmap2D
          (CommandBuffer *this,Ptr<ImageBase> *image,VkPipelineStageFlags src_stage,
          VkPipelineStageFlags dst_stage,VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask
          ,VkImageLayout old_layout,VkImageLayout new_layout)

{
  Ptr<ImageBase> *pPVar1;
  CommandBuffer *this_00;
  uint32_t uVar2;
  VkAccessFlags VVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  VkPipelineStageFlags src_stage_00;
  VkImageLayout old_layout_00;
  ImageBase *pIVar7;
  uint uVar8;
  uint uVar9;
  initializer_list<VkImageSubresourceLayers> __l;
  initializer_list<VkImageSubresourceLayers> __l_00;
  initializer_list<VkImageSubresourceLayers> __l_01;
  initializer_list<VkImageSubresourceLayers> __l_02;
  initializer_list<VkImageSubresourceLayers> __l_03;
  allocator_type local_155;
  VkPipelineStageFlags local_154;
  VkAccessFlags local_150;
  VkAccessFlags local_14c;
  _Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_148;
  _Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_128;
  VkPipelineStageFlags local_104;
  Ptr<ImageBase> *local_100;
  undefined1 local_f8 [24];
  ulong local_e0;
  CommandBuffer *local_d8;
  _Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_d0;
  undefined1 local_b8 [8];
  pointer pVStack_b0;
  pointer local_a8;
  long lStack_a0;
  uint32_t uStack_98;
  uint32_t uStack_94;
  VkImageSubresourceLayers VStack_90;
  undefined1 auStack_80 [16];
  uint uStack_70;
  uint32_t uStack_6c;
  _Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> local_60;
  uint local_48;
  uint32_t uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pIVar7 = (image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar2 = pIVar7->m_mip_levels;
  local_154 = dst_stage;
  local_150 = dst_access_mask;
  local_14c = src_access_mask;
  local_104 = src_stage;
  local_100 = image;
  if (uVar2 == 1) {
    local_60._M_impl.super__Vector_impl_data._M_finish._4_4_ = pIVar7->m_array_layers;
    local_a8 = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8 = (undefined1  [8])0x0;
    pVStack_b0 = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    local_60._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_60;
    std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
              ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
               &local_d0,__l,(allocator_type *)local_f8);
    ImageBase::GetMemoryBarriers
              ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_148,
               pIVar7,(vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *
                      )&local_d0,local_14c,local_150,old_layout,new_layout,0xffffffff,0xffffffff);
    CmdPipelineBarrier(this,local_104,local_154,
                       (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)local_b8,
                       (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                       &local_128,
                       (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                       &local_148);
    std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
              (&local_148);
    std::_Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::
    ~_Vector_base((_Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                   *)&local_d0);
    std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~_Vector_base
              (&local_128);
    std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
              ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)local_b8);
  }
  else {
    local_48 = (pIVar7->m_extent).width;
    uStack_44 = (pIVar7->m_extent).height;
    uStack_40 = 0;
    uStack_3c = 0;
    uVar6 = 1;
    local_d8 = this;
    while (uVar4 = (uint)uVar6, uVar4 < uVar2) {
      local_a8 = (pointer)0x0;
      local_b8._4_4_ = uVar4 - 1;
      local_b8._0_4_ = 1;
      pVStack_b0 = (pointer)((ulong)pIVar7->m_array_layers << 0x20);
      lStack_a0 = (ulong)local_48 << 0x20;
      uStack_94 = (pIVar7->m_extent).depth;
      uStack_98 = uStack_44;
      uVar8 = -(uint)(1 < (int)local_48 / 2);
      uVar9 = -(uint)(1 < (int)uStack_44 / 2);
      uStack_40 = (int)uStack_40 / 2 & -(uint)(0 < (int)uStack_40 / 2);
      uStack_3c = (int)uStack_3c / 2 & -(uint)(0 < (int)uStack_3c / 2);
      local_48 = ~uVar8 & 1 | (int)local_48 / 2 & uVar8;
      uStack_44 = ~uVar9 & 1 | (int)uStack_44 / 2 & uVar9;
      auStack_80._0_4_ = 0;
      auStack_80._4_4_ = 0;
      auStack_80._8_8_ = (ulong)local_48 << 0x20;
      uStack_6c = (pIVar7->m_extent).depth;
      uStack_70 = uStack_44;
      VStack_90.mipLevel = uVar4;
      VStack_90.aspectMask = 1;
      src_stage_00 = 0x1000;
      if (uVar4 == 1) {
        src_stage_00 = local_104;
      }
      local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      VStack_90._8_8_ = (ulong)pIVar7->m_array_layers << 0x20;
      local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8._0_8_ = local_b8;
      local_f8._8_8_ = pVStack_b0;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_f8;
      std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                 &local_60,__l_00,&local_155);
      VVar3 = 0x1000;
      if (uVar4 == 1) {
        VVar3 = local_14c;
      }
      old_layout_00 = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
      if (uVar4 == 1) {
        old_layout_00 = old_layout;
      }
      local_e0 = uVar6;
      ImageBase::GetMemoryBarriers
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d0,
                 pIVar7,(vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                         *)&local_60,VVar3,0x800,old_layout_00,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                 0xffffffff,0xffffffff);
      CmdPipelineBarrier(local_d8,src_stage_00,0x1000,
                         (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_128,
                         (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                         &local_148,
                         (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                         &local_d0);
      std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
                (&local_d0);
      std::_Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::
      ~_Vector_base(&local_60);
      std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::
      ~_Vector_base((_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                    &local_148);
      std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
                ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_128);
      local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pIVar7 = (local_100->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_f8._0_4_ = VStack_90.aspectMask;
      local_f8._4_4_ = VStack_90.mipLevel;
      local_f8._8_4_ = VStack_90.baseArrayLayer;
      local_f8._12_4_ = VStack_90.layerCount;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_f8;
      std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                 &local_60,__l_01,&local_155);
      VVar3 = 0;
      if ((int)local_e0 == 1) {
        VVar3 = local_14c;
      }
      ImageBase::GetMemoryBarriers
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d0,
                 pIVar7,(vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                         *)&local_60,VVar3,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
                 VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
      this_00 = local_d8;
      CmdPipelineBarrier(local_d8,src_stage_00,0x1000,
                         (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_128,
                         (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                         &local_148,
                         (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                         &local_d0);
      std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
                (&local_d0);
      std::_Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::
      ~_Vector_base(&local_60);
      std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::
      ~_Vector_base((_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                    &local_148);
      std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
                ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_128);
      pPVar1 = local_100;
      CmdBlitImage(this_00,local_100,local_100,(VkImageBlit *)local_b8,VK_FILTER_LINEAR);
      local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pIVar7 = (pPVar1->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_f8._0_8_ = local_b8;
      local_f8._8_8_ = pVStack_b0;
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)local_f8;
      std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                 &local_60,__l_02,&local_155);
      ImageBase::GetMemoryBarriers
                ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d0,
                 pIVar7,(vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                         *)&local_60,0,local_150,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,new_layout,
                 0xffffffff,0xffffffff);
      CmdPipelineBarrier(this_00,0x1000,local_154,
                         (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_128,
                         (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                         &local_148,
                         (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                         &local_d0);
      std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~_Vector_base
                (&local_d0);
      std::_Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::
      ~_Vector_base(&local_60);
      std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::
      ~_Vector_base((_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                    &local_148);
      std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
                ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_128);
      pIVar7 = (local_100->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar5 = (int)local_e0;
      if (iVar5 == pIVar7->m_mip_levels - 1) {
        local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8._0_4_ = VStack_90.aspectMask;
        local_f8._4_4_ = VStack_90.mipLevel;
        local_f8._8_4_ = VStack_90.baseArrayLayer;
        local_f8._12_4_ = VStack_90.layerCount;
        __l_03._M_len = 1;
        __l_03._M_array = (iterator)local_f8;
        std::vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::vector
                  ((vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_> *)
                   &local_60,__l_03,&local_155);
        ImageBase::GetMemoryBarriers
                  ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)&local_d0,
                   pIVar7,(vector<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>
                           *)&local_60,0x1000,local_150,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                   new_layout,0xffffffff,0xffffffff);
        CmdPipelineBarrier(this_00,0x1000,local_154,
                           (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_128,
                           (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
                           &local_148,
                           (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
                           &local_d0);
        std::_Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::
        ~_Vector_base(&local_d0);
        std::_Vector_base<VkImageSubresourceLayers,_std::allocator<VkImageSubresourceLayers>_>::
        ~_Vector_base(&local_60);
        std::_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::
        ~_Vector_base((_Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *
                      )&local_148);
        std::_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~_Vector_base
                  ((_Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_128);
        pIVar7 = (local_100->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        iVar5 = (int)local_e0;
      }
      uVar2 = pIVar7->m_mip_levels;
      uVar6 = (ulong)(iVar5 + 1);
    }
  }
  return;
}

Assistant:

void CommandBuffer::CmdGenerateMipmap2D(const Ptr<ImageBase> &image, VkPipelineStageFlags src_stage,
                                        VkPipelineStageFlags dst_stage, VkAccessFlags src_access_mask,
                                        VkAccessFlags dst_access_mask, VkImageLayout old_layout,
                                        VkImageLayout new_layout) const {
	if (image->GetMipLevels() == 1) {
		VkImageSubresourceLayers subresource = {};
		subresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		subresource.mipLevel = 0;
		subresource.baseArrayLayer = 0;
		subresource.layerCount = image->GetArrayLayers();
		CmdPipelineBarrier(
		    src_stage, dst_stage, {}, {},
		    image->GetMemoryBarriers({subresource}, src_access_mask, dst_access_mask, old_layout, new_layout));
		return;
	}
	auto mip_width = (int32_t)image->GetExtent().width, mip_height = (int32_t)image->GetExtent().height;
	for (uint32_t i = 1; i < image->GetMipLevels(); ++i) {
		VkImageBlit blit{};
		blit.srcOffsets[0] = {0, 0, 0};
		blit.srcOffsets[1] = {mip_width, mip_height, (int32_t)image->GetExtent().depth};
		blit.srcSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		blit.srcSubresource.mipLevel = i - 1;
		blit.srcSubresource.baseArrayLayer = 0;
		blit.srcSubresource.layerCount = image->GetArrayLayers();
		mip_width = std::max(mip_width / 2, 1);
		mip_height = std::max(mip_height / 2, 1);
		blit.dstOffsets[0] = {0, 0, 0};
		blit.dstOffsets[1] = {mip_width, mip_height, (int32_t)image->GetExtent().depth};
		blit.dstSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		blit.dstSubresource.mipLevel = i;
		blit.dstSubresource.baseArrayLayer = 0;
		blit.dstSubresource.layerCount = image->GetArrayLayers();

		CmdPipelineBarrier(i == 1 ? src_stage : VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
		                   image->GetMemoryBarriers(
		                       {blit.srcSubresource}, i == 1 ? src_access_mask : VK_ACCESS_TRANSFER_WRITE_BIT,
		                       VK_ACCESS_TRANSFER_READ_BIT, i == 1 ? old_layout : VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		                       VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL));
		CmdPipelineBarrier(i == 1 ? src_stage : VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
		                   image->GetMemoryBarriers({blit.dstSubresource}, i == 1 ? src_access_mask : 0,
		                                            VK_ACCESS_TRANSFER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED,
		                                            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL));

		CmdBlitImage(image, image, blit, VK_FILTER_LINEAR);

		CmdPipelineBarrier(VK_PIPELINE_STAGE_TRANSFER_BIT, dst_stage, {}, {},
		                   image->GetMemoryBarriers({blit.srcSubresource}, 0, dst_access_mask,
		                                            VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, new_layout));
		if (i == image->GetMipLevels() - 1) {
			CmdPipelineBarrier(VK_PIPELINE_STAGE_TRANSFER_BIT, dst_stage, {}, {},
			                   image->GetMemoryBarriers({blit.dstSubresource}, VK_ACCESS_TRANSFER_WRITE_BIT,
			                                            dst_access_mask, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			                                            new_layout));
		}
	}
}